

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedObservableDictionary.hpp
# Opt level: O2

void __thiscall
SortedObservableDictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::SortedObservableDictionary
          (SortedObservableDictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  _Rb_tree_header *p_Var1;
  anon_class_8_1_8991fb9c local_20;
  
  *(undefined ***)this = &PTR__SortedObservableDictionary_001265f0;
  (this->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->_map)._M_t._M_impl.super__Rb_tree_header;
  (this->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::make_shared<std::recursive_mutex>();
  local_20.this = this;
  wigwag::
  signal<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex>
  ::
  signal<std::shared_ptr<std::recursive_mutex>&,SortedObservableDictionary<int,std::__cxx11::string>::SortedObservableDictionary()::_lambda(std::function<void(CollectionOp,int_const&,std::__cxx11::string_const&)>const&)_1_,true,void>
            ((signal<void(CollectionOp,int_const&,std::__cxx11::string_const&),wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex>
              *)&this->_onChanged,&this->_mutex,&local_20);
  local_20.this = this;
  wigwag::
  listenable<std::shared_ptr<IObservableDictionaryListener<int,std::__cxx11::string>>,wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex>
  ::
  listenable<std::shared_ptr<std::recursive_mutex>&,SortedObservableDictionary<int,std::__cxx11::string>::SortedObservableDictionary()::_lambda(std::shared_ptr<IObservableDictionaryListener<int,std::__cxx11::string>>const&)_1_>
            ((listenable<std::shared_ptr<IObservableDictionaryListener<int,std::__cxx11::string>>,wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex>
              *)&this->_listenable,&this->_mutex,&local_20);
  return;
}

Assistant:

SortedObservableDictionary()
        : _mutex(std::make_shared<Mutex>()),
          _onChanged(_mutex, [&](const typename decltype(_onChanged)::handler_type& h) { for (auto p : _map) h(CollectionOp::ItemAdded, p.first, p.second); }),
          _listenable(_mutex, [&](const ListenerPtr& l) { for (auto p : _map) l->OnItemAdded(p.first, p.second); })
    { }